

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O2

int run_test_fs_file_loop(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined8 uVar3;
  char *pcVar4;
  uv_fs_t req;
  uv_fs_t local_1c0;
  
  loop = uv_default_loop();
  unlink("test_symlink");
  iVar1 = uv_fs_symlink((uv_loop_t *)0x0,&local_1c0,"test_symlink","test_symlink",0,(uv_fs_cb)0x0);
  if (iVar1 == 0) {
    uv_fs_req_cleanup(&local_1c0);
    iVar1 = uv_fs_open((uv_loop_t *)0x0,&local_1c0,"test_symlink",0,0,(uv_fs_cb)0x0);
    if (iVar1 == -0x28) {
      if (local_1c0.result == -0x28) {
        uv_fs_req_cleanup(&local_1c0);
        iVar1 = uv_fs_open(loop,&local_1c0,"test_symlink",0,0,open_loop_cb);
        if (iVar1 == 0) {
          if (open_cb_count == 0) {
            uv_run(loop,UV_RUN_DEFAULT);
            if (open_cb_count == 1) {
              unlink("test_symlink");
              puVar2 = uv_default_loop();
              close_loop(puVar2);
              puVar2 = uv_default_loop();
              iVar1 = uv_loop_close(puVar2);
              if (iVar1 == 0) {
                return 0;
              }
              pcVar4 = "0 == uv_loop_close(uv_default_loop())";
              uVar3 = 0x325;
            }
            else {
              pcVar4 = "open_cb_count == 1";
              uVar3 = 0x321;
            }
          }
          else {
            pcVar4 = "open_cb_count == 0";
            uVar3 = 799;
          }
        }
        else {
          pcVar4 = "r == 0";
          uVar3 = 0x31d;
        }
      }
      else {
        pcVar4 = "req.result == UV_ELOOP";
        uVar3 = 0x319;
      }
    }
    else {
      pcVar4 = "r == UV_ELOOP";
      uVar3 = 0x318;
    }
  }
  else {
    pcVar4 = "r == 0";
    uVar3 = 0x314;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
          ,uVar3,pcVar4);
  abort();
}

Assistant:

TEST_IMPL(fs_file_loop) {
  uv_fs_t req;
  int r;

  loop = uv_default_loop();

  unlink("test_symlink");
  r = uv_fs_symlink(NULL, &req, "test_symlink", "test_symlink", 0, NULL);
#ifdef _WIN32
  /*
   * Windows XP and Server 2003 don't support symlinks; we'll get UV_ENOTSUP.
   * Starting with vista they are supported, but only when elevated, otherwise
   * we'll see UV_EPERM.
   */
  if (r == UV_ENOTSUP || r == UV_EPERM)
    return 0;
#elif defined(__MSYS__)
  /* MSYS2's approximation of symlinks with copies does not work for broken
     links.  */
  if (r == UV_ENOENT)
    return 0;
#endif
  ASSERT(r == 0);
  uv_fs_req_cleanup(&req);

  r = uv_fs_open(NULL, &req, "test_symlink", O_RDONLY, 0, NULL);
  ASSERT(r == UV_ELOOP);
  ASSERT(req.result == UV_ELOOP);
  uv_fs_req_cleanup(&req);

  r = uv_fs_open(loop, &req, "test_symlink", O_RDONLY, 0, open_loop_cb);
  ASSERT(r == 0);

  ASSERT(open_cb_count == 0);
  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(open_cb_count == 1);

  unlink("test_symlink");

  MAKE_VALGRIND_HAPPY();
  return 0;
}